

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astlist.c
# Opt level: O0

void InitParams(ASTList *params,int totalFuncs)

{
  int local_18;
  int i;
  int totalFuncs_local;
  ASTList *params_local;
  
  for (local_18 = 0; local_18 < totalFuncs; local_18 = local_18 + 1) {
    params[local_18].first = (ASTListItem *)0x0;
    params[local_18].last = (ASTListItem *)0x0;
    params[local_18].current = (ASTListItem *)0x0;
    params[local_18].size = -1;
    params[local_18].nodeId = -1;
  }
  return;
}

Assistant:

void InitParams(ASTList* params, int totalFuncs){
	for (int i = 0; i < totalFuncs; i++){
		params[i].first = NULL;
		params[i].last = NULL;
		params[i].current = NULL;
		params[i].size = -1;
		params[i].nodeId = -1;
	}
}